

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap_column.h
# Opt level: O2

bool Gudhi::persistence_matrix::operator==
               (Heap_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
                *c1,Heap_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
                    *c2)

{
  uint uVar1;
  uint uVar2;
  Entry *pEVar3;
  Entry *pEVar4;
  bool bVar5;
  Heap_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
  cc2;
  Heap_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
  cc1;
  
  if (c1 == c2) {
    bVar5 = true;
  }
  else {
    Heap_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
    ::Heap_column(&cc1,c1,(Column_settings *)0x0);
    Heap_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
    ::Heap_column(&cc2,c2,(Column_settings *)0x0);
    pEVar3 = Heap_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
             ::_pop_pivot(&cc1);
    pEVar4 = Heap_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
             ::_pop_pivot(&cc2);
    while ((pEVar3 != (Entry *)0x0 && (pEVar4 != (Entry *)0x0))) {
      if (pEVar3->rowIndex_ != pEVar4->rowIndex_) {
        operator_delete(pEVar3,8);
        goto LAB_0011befb;
      }
      uVar1 = (pEVar3->super_Entry_field_element_option).element_;
      uVar2 = (pEVar4->super_Entry_field_element_option).element_;
      operator_delete(pEVar3,8);
      operator_delete(pEVar4,8);
      if (uVar1 != uVar2) goto LAB_0011bf00;
      pEVar3 = Heap_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
               ::_pop_pivot(&cc1);
      pEVar4 = Heap_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
               ::_pop_pivot(&cc2);
    }
    bVar5 = true;
    if (pEVar3 != (Entry *)0x0 || pEVar4 != (Entry *)0x0) {
      if (pEVar3 != (Entry *)0x0) {
        pEVar4 = pEVar3;
      }
LAB_0011befb:
      operator_delete(pEVar4,8);
LAB_0011bf00:
      bVar5 = false;
    }
    Heap_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
    ::~Heap_column(&cc2);
    Heap_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
    ::~Heap_column(&cc1);
  }
  return bVar5;
}

Assistant:

bool operator==(const Heap_column& c1, const Heap_column& c2) {
    if (&c1 == &c2) return true;

    Heap_column cc1(c1), cc2(c2);
    Entry* p1 = cc1._pop_pivot();
    Entry* p2 = cc2._pop_pivot();
    while (p1 != nullptr && p2 != nullptr) {
      if (p1->get_row_index() != p2->get_row_index()) {
        c1.entryPool_->destroy(p1);
        c2.entryPool_->destroy(p2);
        return false;
      }
      if constexpr (!Master_matrix::Option_list::is_z2) {
        if (p1->get_element() != p2->get_element()) {
          c1.entryPool_->destroy(p1);
          c2.entryPool_->destroy(p2);
          return false;
        }
      }
      c1.entryPool_->destroy(p1);
      c2.entryPool_->destroy(p2);
      p1 = cc1._pop_pivot();
      p2 = cc2._pop_pivot();
    }

    if (p1 == nullptr && p2 == nullptr) return true;
    if (p1 != nullptr) {
      c1.entryPool_->destroy(p1);
      return false;
    }
    c2.entryPool_->destroy(p2);
    return false;
  }